

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t spvtools::val::ValidateDecorations(ValidationState_t *vstate)

{
  spv_result_t error_6;
  spv_result_t error_5;
  spv_result_t error_4;
  spv_result_t error_3;
  spv_result_t error_2;
  spv_result_t error_1;
  spv_result_t error;
  ValidationState_t *vstate_local;
  
  vstate_local._4_4_ = anon_unknown_0::CheckImportedVariableInitialization(vstate);
  if ((((vstate_local._4_4_ == SPV_SUCCESS) &&
       (vstate_local._4_4_ = anon_unknown_0::CheckDecorationsOfEntryPoints(vstate),
       vstate_local._4_4_ == SPV_SUCCESS)) &&
      (vstate_local._4_4_ = anon_unknown_0::CheckDecorationsOfBuffers(vstate),
      vstate_local._4_4_ == SPV_SUCCESS)) &&
     (((vstate_local._4_4_ = anon_unknown_0::CheckDecorationsCompatibility(vstate),
       vstate_local._4_4_ == SPV_SUCCESS &&
       (vstate_local._4_4_ = anon_unknown_0::CheckLinkageAttrOfFunctions(vstate),
       vstate_local._4_4_ == SPV_SUCCESS)) &&
      ((vstate_local._4_4_ = anon_unknown_0::CheckVulkanMemoryModelDeprecatedDecorations(vstate),
       vstate_local._4_4_ == SPV_SUCCESS &&
       (vstate_local._4_4_ = anon_unknown_0::CheckDecorationsFromDecoration(vstate),
       vstate_local._4_4_ == SPV_SUCCESS)))))) {
    vstate_local._4_4_ = SPV_SUCCESS;
  }
  return vstate_local._4_4_;
}

Assistant:

spv_result_t ValidateDecorations(ValidationState_t& vstate) {
  if (auto error = CheckImportedVariableInitialization(vstate)) return error;
  if (auto error = CheckDecorationsOfEntryPoints(vstate)) return error;
  if (auto error = CheckDecorationsOfBuffers(vstate)) return error;
  if (auto error = CheckDecorationsCompatibility(vstate)) return error;
  if (auto error = CheckLinkageAttrOfFunctions(vstate)) return error;
  if (auto error = CheckVulkanMemoryModelDeprecatedDecorations(vstate))
    return error;
  if (auto error = CheckDecorationsFromDecoration(vstate)) return error;
  return SPV_SUCCESS;
}